

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

OwnFd * __thiscall
kj::_::NullableValue<kj::OwnFd>::emplace<kj::OwnFd>(NullableValue<kj::OwnFd> *this,OwnFd *params)

{
  if (this->isSet == true) {
    this->isSet = false;
    OwnFd::~OwnFd(&(this->field_1).value);
  }
  (this->field_1).value.fd = params->fd;
  params->fd = -1;
  this->isSet = true;
  return (OwnFd *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }